

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void __thiscall
FIX::double_conversion::RoundUp
          (double_conversion *this,Vector<char> buffer,int *length,int *decimal_point)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  int local_2c;
  int i;
  int *decimal_point_local;
  int *length_local;
  Vector<char> buffer_local;
  
  piVar3 = buffer._8_8_;
  buffer_local.start_._0_4_ = buffer.start_._0_4_;
  length_local = (int *)this;
  if (*piVar3 == 0) {
    pcVar2 = Vector<char>::operator[]((Vector<char> *)&length_local,0);
    *pcVar2 = '1';
    *length = 1;
    *piVar3 = 1;
  }
  else {
    pcVar2 = Vector<char>::operator[]((Vector<char> *)&length_local,*piVar3 + -1);
    *pcVar2 = *pcVar2 + '\x01';
    iVar1 = *piVar3;
    while (local_2c = iVar1 + -1, 0 < local_2c) {
      pcVar2 = Vector<char>::operator[]((Vector<char> *)&length_local,local_2c);
      if (*pcVar2 != ':') {
        return;
      }
      pcVar2 = Vector<char>::operator[]((Vector<char> *)&length_local,local_2c);
      *pcVar2 = '0';
      pcVar2 = Vector<char>::operator[]((Vector<char> *)&length_local,iVar1 + -2);
      *pcVar2 = *pcVar2 + '\x01';
      iVar1 = local_2c;
    }
    pcVar2 = Vector<char>::operator[]((Vector<char> *)&length_local,0);
    if (*pcVar2 == ':') {
      pcVar2 = Vector<char>::operator[]((Vector<char> *)&length_local,0);
      *pcVar2 = '1';
      *length = *length + 1;
    }
  }
  return;
}

Assistant:

static void RoundUp(Vector<char> buffer, int* length, int* decimal_point) {
  // An empty buffer represents 0.
  if (*length == 0) {
    buffer[0] = '1';
    *decimal_point = 1;
    *length = 1;
    return;
  }
  // Round the last digit until we either have a digit that was not '9' or until
  // we reached the first digit.
  buffer[(*length) - 1]++;
  for (int i = (*length) - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) {
      return;
    }
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  // If the first digit is now '0' + 10, we would need to set it to '0' and add
  // a '1' in front. However we reach the first digit only if all following
  // digits had been '9' before rounding up. Now all trailing digits are '0' and
  // we simply switch the first digit to '1' and update the decimal-point
  // (indicating that the point is now one digit to the right).
  if (buffer[0] == '0' + 10) {
    buffer[0] = '1';
    (*decimal_point)++;
  }
}